

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  exception *e;
  double median;
  double mean;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  vector<Reading,_std::allocator<Reading>_> readings;
  char *file_name;
  
  readings.super__Vector_base<Reading,_std::allocator<Reading>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)anon_var_dwarf_3c85;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"raw_temps.txt",&local_51);
  get_readings_from_file((vector<Reading,_std::allocator<Reading>_> *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  dVar2 = get_mean_temp((vector<Reading,_std::allocator<Reading>_> *)local_30);
  dVar3 = get_median_temp((vector<Reading,_std::allocator<Reading>_> *)local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"Median temperature: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1,", mean temperature: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::vector<Reading,_std::allocator<Reading>_>::~vector
            ((vector<Reading,_std::allocator<Reading>_> *)local_30);
  return 0;
}

Assistant:

int main()
{
	const char* file_name{ "raw_temps.txt" };
	try
	{
		auto readings = get_readings_from_file(file_name);
		auto mean = get_mean_temp(readings);
		auto median = get_median_temp(readings);
		std::cout << "Median temperature: " << median
			<< ", mean temperature: " << mean << std::endl;
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
}